

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_handle_lifetime.cpp
# Opt level: O2

ze_result_t __thiscall
validation_layer::ZESHandleLifetimeValidation::zesVFManagementGetVFCapabilitiesExp2Prologue
          (ZESHandleLifetimeValidation *this,zes_vf_handle_t hVFhandle,
          zes_vf_exp2_capabilities_t *pCapability)

{
  bool bVar1;
  ze_result_t zVar2;
  
  bVar1 = HandleLifetimeValidation::isHandleValid<_zes_vf_handle_t*>
                    (*(HandleLifetimeValidation **)(context + 0xd48),hVFhandle);
  zVar2 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  if (bVar1) {
    zVar2 = ZE_RESULT_SUCCESS;
  }
  return zVar2;
}

Assistant:

ze_result_t
    ZESHandleLifetimeValidation::zesVFManagementGetVFCapabilitiesExp2Prologue(
        zes_vf_handle_t hVFhandle,                      ///< [in] Sysman handle for the VF component.
        zes_vf_exp2_capabilities_t* pCapability         ///< [in,out] Will contain VF capability.
        )
    { 
        
        if ( !context.handleLifetime->isHandleValid( hVFhandle )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        return ZE_RESULT_SUCCESS;
    }